

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Floor.cpp
# Opt level: O1

void __thiscall Floor::draw(Floor *this)

{
  pointer pIVar1;
  int l;
  int y;
  int iVar2;
  int color;
  ulong uVar3;
  
  drawWholeRect(this->x,this->y,this->w,this->h,0);
  pIVar1 = (this->infos).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->infos).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.super__Vector_impl_data.
      _M_finish != pIVar1) {
    uVar3 = 0;
    do {
      iVar2 = (int)uVar3;
      switch(pIVar1[uVar3].type) {
      case 1:
        iVar2 = this->x + iVar2;
        y = this->y;
        l = pIVar1[uVar3].height;
        color = 7;
        break;
      case 2:
        iVar2 = this->x + iVar2;
        y = (this->y - pIVar1[uVar3].height) + this->h;
        l = pIVar1[uVar3].height - this->h;
        color = 1;
        break;
      case 3:
        iVar2 = this->x + iVar2;
        y = this->y;
        l = pIVar1[uVar3].height;
        color = 3;
        break;
      case 4:
        iVar2 = this->x + iVar2;
        y = this->y;
        l = pIVar1[uVar3].height;
        color = 5;
        break;
      default:
        goto switchD_00179058_default;
      }
      drawLine(iVar2,y,l,false,color);
switchD_00179058_default:
      uVar3 = uVar3 + 1;
      pIVar1 = (this->infos).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->infos).super__Vector_base<Info,_std::allocator<Info>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 3));
  }
  return;
}

Assistant:

void Floor::draw(){
    drawWholeRect(x, y, w, h, BLACK);
    for(int i = 0; i < infos.size(); ++i){
        switch(infos[i].type){
        case NORMAL_FLOOR:
            break;
        case BREAK_FLOOR:
            drawLine(x+i, y, infos[i].height, 0, WHITE);
            break;
        case DEATH_FLOOR:
            drawLine(x+i, y-(infos[i].height-h), infos[i].height-h, 0, RED);
            break;
        case SCORE_FLOOR:
            drawLine(x+i, y, infos[i].height, 0, YELLOW);
            break;
        case FLOAT_FLOOR:
            drawLine(x+i, y, infos[i].height, 0, PURPLE);
            break;
        }
    }
}